

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
logAndSetTestResult(BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    *this,vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                          *results)

{
  TestContext *this_00;
  int precision;
  float fVar1;
  UploadSampleAnalyzeResult UVar2;
  string local_30;
  
  UVar2 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    (((this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log,results,true)
  ;
  fVar1 = UVar2.transferRateAtInfinity;
  if (this->m_resultType != RESULT_ASYMPTOTIC_TRANSFER_RATE) {
    fVar1 = UVar2.transferRateMedian;
  }
  this_00 = (this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  if (fVar1 < INFINITY) {
    de::floatToString_abi_cxx11_(&local_30,(de *)0x2,fVar1 * 0.0009765625 * 0.0009765625,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_30._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_30,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BasicUploadCase<SampleType>::logAndSetTestResult (const std::vector<UploadSampleResult<SampleType> >& results)
{
	const UploadSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), results, true);

	// with small buffers, report the median transfer rate of the samples
	// with large buffers, report the expected preformance of infinitely large buffers
	const float						rate		= (m_resultType == RESULT_ASYMPTOTIC_TRANSFER_RATE) ? (analysis.transferRateAtInfinity) : (analysis.transferRateMedian);

	if (rate == std::numeric_limits<float>::infinity())
	{
		// sample times are 1) invalid or 2) timer resolution too low
		// report speed 0 bytes / s since real value cannot be determined
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
	}
	else
	{
		// report transfer rate in MB / s
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
	}
}